

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O0

bool __thiscall
psy::C::Parser::parseOffsetOfExpression_AtFirst(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  SyntaxKind SVar2;
  SyntaxToken *pSVar3;
  ostream *poVar4;
  ParseOptions *this_00;
  LanguageExtensions *this_01;
  OffsetOfExpressionSyntax *pOVar5;
  IndexType IVar6;
  bool local_79;
  OffsetOfExpressionSyntax *offsetOfExpr;
  allocator<char> local_41;
  string local_40;
  ExpressionSyntax **local_20;
  ExpressionSyntax **expr_local;
  Parser *this_local;
  
  local_20 = expr;
  expr_local = (ExpressionSyntax **)this;
  pSVar3 = peek(this,1);
  SVar2 = SyntaxToken::kind(pSVar3);
  if (SVar2 != Keyword_ExtGNU___builtin_offsetof) {
    pSVar3 = peek(this,1);
    SVar2 = SyntaxToken::kind(pSVar3);
    if (SVar2 != Keyword_MacroStd_offsetof) {
      poVar4 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2f3);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,"assert failure: `__builtin_offsetof\'");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      return false;
    }
  }
  this_00 = SyntaxTree::parseOptions(this->tree_);
  this_01 = ParseOptions::languageExtensions(this_00);
  bVar1 = LanguageExtensions::isEnabled_extGNU_InternalBuiltins(this_01);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GNU internal builtins",&local_41);
    DiagnosticsReporter::ExpectedFeature(&this->diagReporter_,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  pOVar5 = makeNode<psy::C::OffsetOfExpressionSyntax>(this);
  *local_20 = &pOVar5->super_ExpressionSyntax;
  IVar6 = consume(this);
  pOVar5->kwTkIdx_ = IVar6;
  bVar1 = match(this,OpenParenToken,&pOVar5->openParenTkIdx_);
  local_79 = false;
  if (bVar1) {
    bVar1 = parseTypeName(this,&pOVar5->typeName_);
    local_79 = false;
    if (bVar1) {
      bVar1 = match(this,CommaToken,&pOVar5->commaTkIdx_);
      local_79 = false;
      if (bVar1) {
        bVar1 = parseOffsetOfDesignator(this,&pOVar5->offsetOfDesignator_);
        local_79 = false;
        if (bVar1) {
          local_79 = match(this,CloseParenToken,&pOVar5->closeParenTkIdx_);
        }
      }
    }
  }
  return local_79;
}

Assistant:

bool Parser::parseOffsetOfExpression_AtFirst(ExpressionSyntax*& expr)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword_ExtGNU___builtin_offsetof
                  || peek().kind() == SyntaxKind::Keyword_MacroStd_offsetof,
                  return false,
                  "assert failure: `__builtin_offsetof'");

    if (!tree_->parseOptions().languageExtensions().isEnabled_extGNU_InternalBuiltins())
        diagReporter_.ExpectedFeature("GNU internal builtins");

    auto offsetOfExpr = makeNode<OffsetOfExpressionSyntax>();
    expr = offsetOfExpr;
    offsetOfExpr->kwTkIdx_ = consume();
    return match(SyntaxKind::OpenParenToken, &offsetOfExpr->openParenTkIdx_)
        && parseTypeName(offsetOfExpr->typeName_)
        && match(SyntaxKind::CommaToken, &offsetOfExpr->commaTkIdx_)
        && parseOffsetOfDesignator(offsetOfExpr->offsetOfDesignator_)
        && match(SyntaxKind::CloseParenToken, &offsetOfExpr->closeParenTkIdx_);
}